

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

Var * __thiscall
Js::InlinedFrameWalker::GetArgv(InlinedFrameWalker *this,bool includeThis,bool boxArgsAndDeepCopy)

{
  code *pcVar1;
  bool bVar2;
  InlinedFrame *pIVar3;
  undefined4 *puVar4;
  size_t sVar5;
  Recycler *this_00;
  InlineeCallInfo *args;
  ulong uVar6;
  size_t sVar7;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  pIVar3 = GetCurrentFrame(this);
  if (pIVar3 == (InlinedFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x567,"(currentFrame)","currentFrame");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  sVar5 = GetArgc(this);
  uVar6 = (ulong)!includeThis;
  if (boxArgsAndDeepCopy) {
    sVar5 = sVar5 - uVar6;
    local_60 = (undefined1  [8])&void*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_4dfd6e0;
    data.filename._0_4_ = 0x572;
    data.plusSize = sVar5;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((((((this->parentFunction->super_ScriptFunctionBase).
                              super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                              type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                          scriptContext.ptr)->recycler,(TrackAllocData *)local_60);
    data._32_8_ = pIVar3;
    args = (InlineeCallInfo *)
           Memory::AllocateArray<Memory::Recycler,void*,false>
                     ((Memory *)this_00,(Recycler *)Memory::Recycler::Alloc,0,sVar5);
    for (sVar7 = 0; sVar5 != sVar7; sVar7 = sVar7 + 1) {
      args[sVar7] = *(InlineeCallInfo *)(data._32_8_ + uVar6 * 8 + 0x18 + sVar7 * 8);
    }
    FinalizeStackValues(this,(Var *)args,sVar5,true);
  }
  else {
    args = &pIVar3[1].super_InlinedFrameLayout.callInfo + uVar6;
  }
  return (Var *)args;
}

Assistant:

Js::Var *InlinedFrameWalker::GetArgv(bool includeThis, bool boxArgsAndDeepCopy) const
    {
        InlinedFrameWalker::InlinedFrame *const currentFrame = GetCurrentFrame();
        Assert(currentFrame);

        uint firstArg = includeThis ? InlinedFrameArgIndex_This : InlinedFrameArgIndex_SecondScriptArg;
        size_t argCount = this->GetArgc() - firstArg;
        Js::Var *args;
        if (!boxArgsAndDeepCopy)
        {
            args = &currentFrame->argv[firstArg];
        }
        else
        {
            args = RecyclerNewArray(parentFunction->GetScriptContext()->GetRecycler(), Js::Var, argCount);
            for (size_t i = 0; i < argCount; i++)
            {
                args[i] = currentFrame->argv[firstArg + i];
            }

            this->FinalizeStackValues(args, argCount, true /*deepCopy*/);
        }

        return args;
    }